

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

CMConnection CMinternal_get_conn(CManager_conflict cm,attr_list attrs)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  CMConnection conn;
  pthread_t pVar4;
  FILE *pFVar5;
  long lVar6;
  int target_cm_id;
  timespec ts;
  timespec local_40;
  
  iVar2 = CManager_locked(cm);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                  ,0x6a3,"CMConnection CMinternal_get_conn(CManager, attr_list)");
  }
  pFVar5 = (FILE *)cm->CMTrace_file;
  if (pFVar5 == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMConnectionVerbose);
    if (iVar2 != 0) {
      pFVar5 = (FILE *)cm->CMTrace_file;
      goto LAB_0011b065;
    }
  }
  else if (CMtrace_val[2] != 0) {
LAB_0011b065:
    fwrite("In CMinternal_get_conn, attrs ",0x1e,1,pFVar5);
    if (attrs == (attr_list)0x0) {
      fputc(10,(FILE *)cm->CMTrace_file);
    }
    else {
      fdump_attr_list((FILE *)cm->CMTrace_file,attrs);
    }
  }
  get_int_attr(attrs,CM_CMANAGER_ID);
  iVar2 = cm->connection_count;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      conn = cm->connections[lVar6];
      if ((conn->closed == 0) && (conn->failed == 0)) {
        if ((conn->remote_CManager_ID == -1) ||
           (iVar2 = (*conn->trans->connection_eq)
                              (cm,&CMstatic_trans_svcs,conn->trans,attrs,conn->transport_data),
           iVar2 != 0)) {
          iVar2 = CMtrace_val[7];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar2 = CMtrace_init(conn->cm,CMFreeVerbose);
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              pFVar5 = (FILE *)conn->cm->CMTrace_file;
              _Var3 = getpid();
              pVar4 = pthread_self();
              fprintf(pFVar5,"P%lxT%lx - ",(long)_Var3,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "internal_get_conn found conn=%p ref count will be %d\n",conn,
                    (ulong)(conn->conn_ref_count + 1));
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          iVar2 = CMtrace_val[2];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar2 = CMtrace_init(conn->cm,CMConnectionVerbose);
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              pFVar5 = (FILE *)conn->cm->CMTrace_file;
              _Var3 = getpid();
              pVar4 = pthread_self();
              fprintf(pFVar5,"P%lxT%lx - ",(long)_Var3,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "internal_get_conn found conn=%p ref count will be %d\n",conn,
                    (ulong)(conn->conn_ref_count + 1));
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          conn->conn_ref_count = conn->conn_ref_count + 1;
          goto LAB_0011b40c;
        }
        iVar2 = cm->connection_count;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  pFVar5 = (FILE *)cm->CMTrace_file;
  if (pFVar5 == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMConnectionVerbose);
    if (iVar2 == 0) goto LAB_0011b15f;
    pFVar5 = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[2] == 0) goto LAB_0011b15f;
  fwrite("In CMinternal_get_conn, no existing connection found, initiating\n",0x41,1,pFVar5);
LAB_0011b15f:
  conn = CMinternal_initiate_conn(cm,attrs);
  if (conn == (CMConnection)0x0) {
    bVar1 = true;
    conn = (CMConnection)0x0;
  }
  else {
    iVar2 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)conn->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "internal_get_conn initiated connection %p ref count now %d\n",conn,
              (ulong)(uint)conn->conn_ref_count);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
LAB_0011b40c:
    iVar2 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)conn->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"internal_get_conn returning conn=%p ref count %d\n",
              conn,(ulong)(uint)conn->conn_ref_count);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    bVar1 = false;
  }
  pFVar5 = (FILE *)cm->CMTrace_file;
  if (pFVar5 == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMConnectionVerbose);
    if (iVar2 == 0) {
      return conn;
    }
    pFVar5 = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[2] == 0) {
    return conn;
  }
  fwrite("CMinternal_get_conn returning ",0x1e,1,pFVar5);
  if (bVar1) {
    fwrite("NULL\n",5,1,(FILE *)cm->CMTrace_file);
  }
  else {
    fdump_CMConnection(cm->CMTrace_file,conn);
  }
  return conn;
}

Assistant:

CMConnection
 CMinternal_get_conn(CManager cm, attr_list attrs)
 {
     int i;
     CMConnection conn = NULL;
     assert(CManager_locked(cm));
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "In CMinternal_get_conn, attrs ");
	 if (attrs) fdump_attr_list(cm->CMTrace_file, attrs); else fprintf(cm->CMTrace_file, "\n");
     }
     int target_cm_id = -1;
     (void) get_int_attr(attrs, CM_CMANAGER_ID, &target_cm_id);
     for (i=0; i<cm->connection_count; i++) {
	 CMConnection tmp = cm->connections[i];
	 if (tmp->closed || tmp->failed) continue;

	 if ((tmp->remote_CManager_ID == target_cm_id) ||
	     tmp->trans->connection_eq(cm, &CMstatic_trans_svcs,
				       tmp->trans, attrs,
				       tmp->transport_data)) {

	     CMtrace_out(tmp->cm, CMFreeVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     CMtrace_out(tmp->cm, CMConnectionVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     tmp->conn_ref_count++;
	     conn = tmp;
	     break;
	 }
     }
     if (conn == NULL) {
	 if (CMtrace_on(cm, CMConnectionVerbose)) {
	     fprintf(cm->CMTrace_file, "In CMinternal_get_conn, no existing connection found, initiating\n");
	 }
	 conn = CMinternal_initiate_conn(cm, attrs);
	 if (conn) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn initiated connection %p ref count now %d\n", 
			 conn, conn->conn_ref_count);
	 }
     }
     if (conn != NULL) {
	 CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn returning conn=%p ref count %d\n", 
		     conn, conn->conn_ref_count);
     }
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "CMinternal_get_conn returning ");
	 if (conn != NULL) {
	     fdump_CMConnection(cm->CMTrace_file, conn);
	 } else {
	     fprintf(cm->CMTrace_file, "NULL\n");
	 }
     }
     return conn;
 }